

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O3

bool __thiscall
wallet::LegacyDataSPKM::CheckDecryptionKey(LegacyDataSPKM *this,CKeyingMaterial *master_key)

{
  _Base_ptr *pub_key;
  _Rb_tree_header *p_Var1;
  size_t sVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  mapped_type *keyMeta;
  _Base_ptr p_Var7;
  runtime_error *this_00;
  long in_FS_OFFSET;
  bool bVar8;
  string_view logging_function;
  span<const_unsigned_char,_18446744073709551615UL> crypted_secret;
  string_view source_file;
  undefined1 local_80 [8];
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_78;
  WalletBatch local_70;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  CKeyID local_4c;
  long local_38;
  WalletDatabase *pWVar6;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  criticalblock1.super_unique_lock._M_device =
       &(this->super_FillableSigningProvider).cs_KeyStore.super_recursive_mutex;
  criticalblock1.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock1.super_unique_lock);
  if ((this->super_FillableSigningProvider).mapKeys._M_t._M_impl.super__Rb_tree_header._M_node_count
      != 0) {
    __assert_fail("mapKeys.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                  ,0xef,
                  "virtual bool wallet::LegacyDataSPKM::CheckDecryptionKey(const CKeyingMaterial &)"
                 );
  }
  p_Var7 = (this->mapCryptedKeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sVar2 = (this->mapCryptedKeys)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  iVar5 = (*((this->super_ScriptPubKeyMan).m_storage)->_vptr_WalletStorage[3])();
  pWVar6 = (WalletDatabase *)CONCAT44(extraout_var,iVar5);
  (*pWVar6->_vptr_WalletDatabase[0xe])(&local_70,pWVar6,1);
  bVar8 = sVar2 == 0;
  p_Var1 = &(this->mapCryptedKeys)._M_t._M_impl.super__Rb_tree_header;
  local_70.m_database = pWVar6;
  if ((_Rb_tree_header *)p_Var7 == p_Var1) {
    if (sVar2 != 0) goto LAB_00210f96;
LAB_00210f9a:
    this->fDecryptionThoroughlyChecked = true;
    bVar8 = true;
  }
  else {
    bVar4 = false;
    do {
      pub_key = &p_Var7[1]._M_right;
      local_80[0] = false;
      local_78._M_head_impl = (array<unsigned_char,_32UL> *)0x0;
      crypted_secret._M_extent._M_extent_value =
           (long)p_Var7[4]._M_parent - (long)*(pointer *)(p_Var7 + 4);
      crypted_secret._M_ptr = *(pointer *)(p_Var7 + 4);
      bVar3 = DecryptKey(master_key,crypted_secret,(CPubKey *)pub_key,(CKey *)local_80);
      if (bVar3) {
        if (this->fDecryptionThoroughlyChecked != false) {
          bVar8 = true;
          goto LAB_00210e92;
        }
        CPubKey::GetID(&local_4c,(CPubKey *)pub_key);
        keyMeta = std::
                  map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
                  ::operator[](&this->mapKeyMetadata,&local_4c);
        WalletBatch::WriteCryptedKey
                  (&local_70,(CPubKey *)pub_key,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(p_Var7 + 4),keyMeta);
        bVar8 = true;
        bVar3 = true;
      }
      else {
        bVar4 = true;
LAB_00210e92:
        bVar3 = false;
      }
      if (local_78._M_head_impl != (array<unsigned_char,_32UL> *)0x0) {
        SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                  ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_78,
                   local_78._M_head_impl);
      }
      if (!bVar3) break;
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var1);
    if (bVar8) {
      if (bVar4) {
        logging_function._M_str = "CheckDecryptionKey";
        logging_function._M_len = 0x12;
        source_file._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
        ;
        source_file._M_len = 0x6a;
        LogPrintFormatInternal<>
                  (logging_function,source_file,0x109,ALL,Info,(ConstevalFormatString<0U>)0x4a2537);
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (this_00,
                   "Error unlocking wallet: some keys decrypt but not all. Your wallet file may be corrupt."
                  );
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_00211080;
      }
      goto LAB_00210f9a;
    }
LAB_00210f96:
    bVar8 = false;
  }
  if (local_70.m_batch._M_t.
      super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>._M_t
      .super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>.
      super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>)0x0) {
    (*(*(_func_int ***)
        local_70.m_batch._M_t.
        super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
        _M_t.
        super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
        .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl)[5])();
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock1.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar8;
  }
LAB_00211080:
  __stack_chk_fail();
}

Assistant:

bool LegacyDataSPKM::CheckDecryptionKey(const CKeyingMaterial& master_key)
{
    {
        LOCK(cs_KeyStore);
        assert(mapKeys.empty());

        bool keyPass = mapCryptedKeys.empty(); // Always pass when there are no encrypted keys
        bool keyFail = false;
        CryptedKeyMap::const_iterator mi = mapCryptedKeys.begin();
        WalletBatch batch(m_storage.GetDatabase());
        for (; mi != mapCryptedKeys.end(); ++mi)
        {
            const CPubKey &vchPubKey = (*mi).second.first;
            const std::vector<unsigned char> &vchCryptedSecret = (*mi).second.second;
            CKey key;
            if (!DecryptKey(master_key, vchCryptedSecret, vchPubKey, key))
            {
                keyFail = true;
                break;
            }
            keyPass = true;
            if (fDecryptionThoroughlyChecked)
                break;
            else {
                // Rewrite these encrypted keys with checksums
                batch.WriteCryptedKey(vchPubKey, vchCryptedSecret, mapKeyMetadata[vchPubKey.GetID()]);
            }
        }
        if (keyPass && keyFail)
        {
            LogPrintf("The wallet is probably corrupted: Some keys decrypt but not all.\n");
            throw std::runtime_error("Error unlocking wallet: some keys decrypt but not all. Your wallet file may be corrupt.");
        }
        if (keyFail || !keyPass)
            return false;
        fDecryptionThoroughlyChecked = true;
    }
    return true;
}